

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.h
# Opt level: O0

void * __thiscall re2::Prog::PrefixAccel(Prog *this,void *data,size_t size)

{
  bool bVar1;
  size_t size_local;
  void *data_local;
  Prog *this_local;
  
  bVar1 = can_prefix_accel(this);
  if (!bVar1) {
    __assert_fail("can_prefix_accel()",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O0/_deps/re2-src/re2/prog.h"
                  ,0xe0,"const void *re2::Prog::PrefixAccel(const void *, size_t)");
  }
  if ((this->prefix_foldcase_ & 1U) == 0) {
    if (this->prefix_size_ == 1) {
      this_local = (Prog *)memchr(data,(this->field_11).field_1.prefix_front_,size);
    }
    else {
      this_local = (Prog *)PrefixAccel_FrontAndBack(this,data,size);
    }
  }
  else {
    this_local = (Prog *)PrefixAccel_ShiftDFA(this,data,size);
  }
  return this_local;
}

Assistant:

const void* PrefixAccel(const void* data, size_t size) {
    DCHECK(can_prefix_accel());
    if (prefix_foldcase_) {
      return PrefixAccel_ShiftDFA(data, size);
    } else if (prefix_size_ != 1) {
      return PrefixAccel_FrontAndBack(data, size);
    } else {
      return memchr(data, prefix_front_, size);
    }
  }